

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true,_false,_false>::
visit<slang::ast::BinaryExpression>
          (ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true,_false,_false> *this,
          BinaryExpression *t)

{
  bool bVar1;
  
  bVar1 = Expression::bad(&t->super_Expression);
  if (bVar1) {
    return;
  }
  BinaryExpression::visitExprs<slang::ast::builtins::MonitorVisitor&>(t,(MonitorVisitor *)this);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }